

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

void output_token_noswap(Context_conflict *ctx,uint32 token)

{
  uint32 token_local;
  uint pos;
  char *local_20;
  ulong local_18;
  
  if (ctx->isfail == 0) {
    token_local = token;
    buffer_append(ctx->output,&token_local,4);
    pos = 0;
    local_20 = preprocessor_sourcepos(ctx->preprocessor,&pos);
    local_18 = (ulong)pos;
    buffer_append(ctx->token_to_source,&local_20,0x10);
  }
  return;
}

Assistant:

static void output_token_noswap(Context *ctx, const uint32 token)
{
    if (!isfail(ctx))
    {
        buffer_append(ctx->output, &token, sizeof (token));

        // We only need a list of these that grows throughout processing, and
        //  is flattened for reference at the end of the run, so we use a
        //  Buffer. It's sneaky!
        unsigned int pos = 0;
        const char *fname = preprocessor_sourcepos(ctx->preprocessor, &pos);
        SourcePos srcpos;
        memset(&srcpos, '\0', sizeof (SourcePos));
        srcpos.line = pos;
        srcpos.filename = fname;  // cached in preprocessor!
        buffer_append(ctx->token_to_source, &srcpos, sizeof (SourcePos));
    } // if
}